

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O3

void removeExpiredTwinRequestsFromList
               (PMQTTTRANSPORT_HANDLE_DATA transport_data,tickcounter_ms_t current_ms,
               DLIST_ENTRY *twin_list)

{
  PDLIST_ENTRY __ptr;
  DLIST_ENTRY_TAG *pDVar1;
  PDLIST_ENTRY Entry;
  
  pDVar1 = twin_list->Flink;
joined_r0x00130990:
  do {
    Entry = pDVar1;
    if (Entry == twin_list) {
      return;
    }
    pDVar1 = Entry->Flink;
    __ptr = Entry + -3;
    if (*(int *)&Entry[-1].Blink == 0) goto LAB_001309df;
  } while ((*(int *)&Entry[-1].Blink != 1) || (current_ms - (long)__ptr->Flink < 60000));
  if (Entry[1].Flink != (DLIST_ENTRY_TAG *)0x0) {
    (*(code *)Entry[1].Flink)(0,0,0,Entry[1].Blink);
  }
  goto LAB_00130a06;
LAB_001309df:
  if (299999 < current_ms - (long)__ptr->Flink) {
    (*(transport_data->transport_callbacks).twin_rpt_state_complete_cb)
              (*(uint32_t *)((long)&Entry[-2].Blink + 4),0x198,transport_data->transport_ctx);
LAB_00130a06:
    DList_RemoveEntryList(Entry);
    free(__ptr);
  }
  goto joined_r0x00130990;
}

Assistant:

static void removeExpiredTwinRequestsFromList(PMQTTTRANSPORT_HANDLE_DATA transport_data, tickcounter_ms_t current_ms, DLIST_ENTRY* twin_list)
{
    PDLIST_ENTRY list_item = twin_list->Flink;

    while (list_item != twin_list)
    {
        DLIST_ENTRY next_list_item;
        next_list_item.Flink = list_item->Flink;
        MQTT_DEVICE_TWIN_ITEM* msg_entry = containingRecord(list_item, MQTT_DEVICE_TWIN_ITEM, entry);
        bool item_timed_out = false;

        if ((msg_entry->device_twin_msg_type == RETRIEVE_PROPERTIES) &&
            (((current_ms - msg_entry->msgCreationTime) / 1000) >= ON_DEMAND_GET_TWIN_REQUEST_TIMEOUT_SECS))
        {
            item_timed_out = true;
            if (msg_entry->userCallback != NULL)
            {
                msg_entry->userCallback(DEVICE_TWIN_UPDATE_COMPLETE, NULL, 0, msg_entry->userContext);
            }
        }
        else if ((msg_entry->device_twin_msg_type == REPORTED_STATE) &&
                 (((current_ms - msg_entry->msgCreationTime) / 1000) >= TWIN_REPORT_UPDATE_TIMEOUT_SECS))
        {
            item_timed_out = true;
            transport_data->transport_callbacks.twin_rpt_state_complete_cb(msg_entry->iothub_msg_id, STATUS_CODE_TIMEOUT_VALUE, transport_data->transport_ctx);
        }

        if (item_timed_out)
        {
            (void)DList_RemoveEntryList(list_item);
            destroyDeviceTwinGetMsg(msg_entry);
        }

        list_item = next_list_item.Flink;
    }

}